

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  size_t sVar10;
  Variable<tcu::Vector<float,_3>_> *pVVar11;
  Variable<float> *pVVar12;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *pVVar13;
  size_type sVar14;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement> *this_00;
  Statement *this_01;
  Expr<tcu::Vector<float,_3>_> *this_02;
  IVal *pIVar15;
  IVal *pIVar16;
  IVal local_100;
  ulong local_b8;
  size_t ndx;
  EvalContext funCtx;
  IArgs *mutArgs;
  Environment funEnv;
  IArgs *args_local;
  EvalContext *ctx_local;
  DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  IRet *ret;
  
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  Environment::Environment((Environment *)&mutArgs);
  sVar10 = funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  initialize(this);
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
            ::operator*(&(this->m_var0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                       );
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&mutArgs,pVVar11,
             *(IVal **)funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
            ::operator*(&(this->m_var1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                       );
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&mutArgs,pVVar11,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
  pVVar12 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                      (&(this->m_var2).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  Environment::bind<float>
            ((Environment *)&mutArgs,pVVar12,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
  pVVar13 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(this->m_var3).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&mutArgs,pVVar13,
             *(IVal **)(funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18));
  EvalContext::EvalContext
            ((EvalContext *)&ndx,&ctx->format,ctx->floatPrecision,(Environment *)&mutArgs,
             ctx->callDepth);
  local_b8 = 0;
  while( true ) {
    uVar9 = local_b8;
    sVar14 = std::
             vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
             ::size(&this->m_body);
    if (sVar14 <= uVar9) break;
    this_00 = &std::
               vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
               ::operator[](&this->m_body,local_b8)->
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>;
    this_01 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::operator->(this_00);
    Statement::execute(this_01,(EvalContext *)&ndx);
    local_b8 = local_b8 + 1;
  }
  this_02 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>::
            operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>
                        *)&this->m_ret);
  Expr<tcu::Vector<float,_3>_>::evaluate(&local_100,this_02,(EvalContext *)&ndx);
  __return_storage_ptr__->m_data[2].m_hi = local_100.m_data[2].m_hi;
  __return_storage_ptr__->m_data[2].m_hasNaN = local_100.m_data[2].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[2].field_0x1 = local_100.m_data[2]._1_7_;
  __return_storage_ptr__->m_data[2].m_lo = local_100.m_data[2].m_lo;
  __return_storage_ptr__->m_data[1].m_lo = local_100.m_data[1].m_lo;
  __return_storage_ptr__->m_data[1].m_hi = local_100.m_data[1].m_hi;
  __return_storage_ptr__->m_data[0].m_hi = local_100.m_data[0].m_hi;
  __return_storage_ptr__->m_data[1].m_hasNaN = local_100.m_data[1].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = local_100.m_data[1]._1_7_;
  __return_storage_ptr__->m_data[0].m_hasNaN = local_100.m_data[0].m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = local_100.m_data[0]._1_7_;
  __return_storage_ptr__->m_data[0].m_lo = local_100.m_data[0].m_lo;
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
            ::operator*(&(this->m_var0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                       );
  pIVar15 = Environment::lookup<tcu::Vector<float,3>>((Environment *)&mutArgs,pVVar11);
  puVar1 = *(undefined8 **)sVar10;
  puVar1[8] = pIVar15->m_data[2].m_hi;
  uVar2 = *(undefined8 *)pIVar15->m_data;
  dVar3 = pIVar15->m_data[0].m_lo;
  dVar4 = pIVar15->m_data[0].m_hi;
  uVar5 = *(undefined8 *)(pIVar15->m_data + 1);
  dVar6 = pIVar15->m_data[1].m_lo;
  dVar7 = pIVar15->m_data[1].m_hi;
  dVar8 = pIVar15->m_data[2].m_lo;
  puVar1[6] = *(undefined8 *)(pIVar15->m_data + 2);
  puVar1[7] = dVar8;
  puVar1[4] = dVar6;
  puVar1[5] = dVar7;
  puVar1[2] = dVar4;
  puVar1[3] = uVar5;
  *puVar1 = uVar2;
  puVar1[1] = dVar3;
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
            ::operator*(&(this->m_var1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                       );
  pIVar15 = Environment::lookup<tcu::Vector<float,3>>((Environment *)&mutArgs,pVVar11);
  puVar1 = *(undefined8 **)(sVar10 + 8);
  puVar1[8] = pIVar15->m_data[2].m_hi;
  uVar2 = *(undefined8 *)pIVar15->m_data;
  dVar3 = pIVar15->m_data[0].m_lo;
  dVar4 = pIVar15->m_data[0].m_hi;
  uVar5 = *(undefined8 *)(pIVar15->m_data + 1);
  dVar6 = pIVar15->m_data[1].m_lo;
  dVar7 = pIVar15->m_data[1].m_hi;
  dVar8 = pIVar15->m_data[2].m_lo;
  puVar1[6] = *(undefined8 *)(pIVar15->m_data + 2);
  puVar1[7] = dVar8;
  puVar1[4] = dVar6;
  puVar1[5] = dVar7;
  puVar1[2] = dVar4;
  puVar1[3] = uVar5;
  *puVar1 = uVar2;
  puVar1[1] = dVar3;
  pVVar12 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                      (&(this->m_var2).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  pIVar16 = Environment::lookup<float>((Environment *)&mutArgs,pVVar12);
  puVar1 = *(undefined8 **)(sVar10 + 0x10);
  puVar1[2] = pIVar16->m_hi;
  dVar3 = pIVar16->m_lo;
  *puVar1 = *(undefined8 *)pIVar16;
  puVar1[1] = dVar3;
  pVVar13 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(this->m_var3).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)&mutArgs,pVVar13);
  Environment::~Environment((Environment *)&mutArgs);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}